

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool CLI::detail::is_separator(string *str)

{
  bool bVar1;
  int iVar2;
  allocator<char> *unaff_retaddr;
  char *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  __type_conflict local_29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  if (is_separator(std::__cxx11::string_const&)::sep_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&is_separator(std::__cxx11::string_const&)::sep_abi_cxx11_);
    if (iVar2 != 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                (in_stack_00000010,in_stack_00000008,unaff_retaddr);
      ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffff7);
      __cxa_atexit(::std::__cxx11::string::~string,
                   &is_separator(std::__cxx11::string_const&)::sep_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&is_separator(std::__cxx11::string_const&)::sep_abi_cxx11_);
    }
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x19dcb9);
  local_29 = true;
  if (!bVar1) {
    local_29 = ::std::operator==(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  }
  return local_29;
}

Assistant:

inline bool is_separator(const std::string &str) {
    static const std::string sep("%%");
    return (str.empty() || str == sep);
}